

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixserver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  LogUnixServer *this;
  allocator<char> local_39;
  string local_38 [32];
  
  this = (LogUnixServer *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"/tmp/TestLogServer",&local_39);
  liblogger::LogUnixServer::LogUnixServer(this,local_38);
  liblogger::LogManager::Add((ILogger *)this);
  std::__cxx11::string::~string(local_38);
  sleep(2);
  liblogger::LogManager::PrintAll();
  liblogger::LogDebug("Debug Logging #1");
  liblogger::LogDebug("Debug Logging #%d",2);
  liblogger::LogInfo("Info Logging #1");
  liblogger::LogInfo("Info Logging #%d",2);
  liblogger::LogNotice("Notice Logging #1");
  liblogger::LogNotice("%s Logging #2","Notice");
  liblogger::LogWarning("Warning!!!!!!");
  liblogger::LogWarning("Warning!!!!!! #%d",2);
  liblogger::LogError("This is an Error");
  liblogger::LogError("This is an Error %d",2);
  liblogger::LogError("Something Critical happened");
  liblogger::LogError("Something Critical happened %s","Really BAD!");
  liblogger::LogAlert("Alert Alert");
  liblogger::LogAlert("Alert Alert %s","Alert");
  liblogger::LogCritical("TestLog Critical!");
  liblogger::LogEmergency("TestLog Emergency!");
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogUnixServer("/tmp/TestLogServer"));

	sleep(2);

	examples();

	LogManager::RemoveAll();
	return 0;
}